

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String testing::FormatCxxExceptionMessage(char *description,char *location)

{
  Message *pMVar1;
  size_t extraout_RDX;
  long in_RSI;
  internal *in_RDI;
  String SVar2;
  Message message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char *local_20;
  char *local_18;
  
  Message::Message((Message *)&local_28);
  if (in_RSI == 0) {
    Message::operator<<((Message *)&local_28,(char (*) [22])"Unknown C++ exception");
  }
  else {
    pMVar1 = Message::operator<<((Message *)&local_28,
                                 (char (*) [33])"C++ exception with description \"");
    pMVar1 = Message::operator<<(pMVar1,&local_18);
    Message::operator<<(pMVar1,(char (*) [2])0x139108);
  }
  pMVar1 = Message::operator<<((Message *)&local_28,(char (*) [12])" thrown in ");
  pMVar1 = Message::operator<<(pMVar1,&local_20);
  Message::operator<<(pMVar1,(char (*) [2])0x1375b7);
  internal::StringStreamToString(in_RDI,local_28.ptr_);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

static internal::String FormatCxxExceptionMessage(const char* description,
                                                  const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}